

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O1

bool __thiscall csv::icu::StringDataSource::set(StringDataSource *this,string *text,char *codepage)

{
  size_t sVar1;
  bool bVar2;
  char *__s;
  string cp;
  detected_language detected;
  char *local_90 [2];
  char local_80 [16];
  detected_language local_70;
  
  __s = "";
  if (codepage != (char *)0x0) {
    __s = codepage;
  }
  local_90[0] = local_80;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,__s,__s + sVar1);
  if (codepage == (char *)0x0) {
    encoding::TextEncodingForData(&local_70,(text->_M_dataplus)._M_p,text->_M_string_length);
    if (local_70.name._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.language._M_dataplus._M_p != &local_70.language.field_2) {
        operator_delete(local_70.language._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p);
      }
      bVar2 = false;
      goto LAB_00116b6f;
    }
    std::__cxx11::string::_M_assign((string *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.language._M_dataplus._M_p != &local_70.language.field_2) {
      operator_delete(local_70.language._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
      operator_delete(local_70.name._M_dataplus._M_p);
    }
  }
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)&local_70,(text->_M_dataplus)._M_p,(int)text->_M_string_length,
             local_90[0]);
  icu_70::UnicodeString::operator=(&this->_in,(UnicodeString *)&local_70);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
  bVar2 = true;
LAB_00116b6f:
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return bVar2;
}

Assistant:

bool StringDataSource::set(const std::string& text, const char* codepage) {
		std::string cp = codepage ?: "";
		if (codepage == NULL) {
			const auto detected = encoding::TextEncodingForData(text.c_str(), text.length());
			if (detected.invalid()) {
				return false;
			}
			cp = detected.name;
		}

		_in = U_ICU_NAMESPACE::UnicodeString(text.c_str(), (int)(text.length()), cp.c_str());
		return true;
	}